

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O3

UINT8 __thiscall DROPlayer::Start(DROPlayer *this)

{
  RESMPL_STATE *CAA;
  DEVFUNC_SETLOGCB p_Var1;
  DEVFUNC_OPTMASK p_Var2;
  PLAYER_EVENT_CB p_Var3;
  UINT8 UVar4;
  byte bVar5;
  UINT32 UVar6;
  size_t sVar7;
  DEV_GEN_CFG *cfg;
  pointer pDVar8;
  pointer puVar9;
  UINT32 *pUVar10;
  size_t sVar11;
  
  *(undefined4 *)this->_optDevMap = 0xffffffff;
  *(undefined4 *)((long)this->_optDevMap + 4) = 0xffffffff;
  *(undefined4 *)(this->_optDevMap + 1) = 0xffffffff;
  *(undefined4 *)((long)this->_optDevMap + 0xc) = 0xffffffff;
  this->_optDevMap[2] = 0xffffffffffffffff;
  pDVar8 = (this->_devices).
           super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devices).
      super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>._M_impl.
      super__Vector_impl_data._M_finish != pDVar8) {
    (this->_devices).
    super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>._M_impl.
    super__Vector_impl_data._M_finish = pDVar8;
  }
  std::vector<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>::resize
            (&this->_devices,
             (long)(this->_devTypes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->_devTypes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  puVar9 = (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar9) {
    sVar11 = 0;
    do {
      pDVar8 = (this->_devices).
               super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>.
               _M_impl.super__Vector_impl_data._M_start;
      cfg = (this->_devCfgs).
            super__Vector_base<_device_generic_config,_std::allocator<_device_generic_config>_>.
            _M_impl.super__Vector_impl_data._M_start + sVar11;
      pDVar8[sVar11].base.defInf.dataPtr = (DEV_DATA *)0x0;
      pDVar8[sVar11].base.linkDev = (VGM_BASEDEV *)0x0;
      sVar7 = DeviceID2OptionID(this,(UINT32)sVar11);
      pDVar8[sVar11].optID = sVar7;
      pUVar10 = this->_devOpts[sVar7].emuCore;
      if (sVar7 == 0xffffffffffffffff) {
        cfg->emuCore = 0;
        cfg->srMode = '\0';
LAB_0010dc6b:
        UVar6 = (this->super_PlayerBase)._outSmplRate;
      }
      else {
        cfg->emuCore = *pUVar10;
        cfg->srMode = *(UINT8 *)(pUVar10 + 2);
        UVar6 = pUVar10[3];
        if (UVar6 == 0) goto LAB_0010dc6b;
      }
      pDVar8 = pDVar8 + sVar11;
      cfg->smplRate = UVar6;
      UVar4 = SndEmu_Start(puVar9[sVar11],cfg,(DEV_INFO *)pDVar8);
      if (UVar4 == '\0') {
        SndEmu_GetDeviceFunc((pDVar8->base).defInf.devDef,'\0','\x11',0,&pDVar8->write);
        (pDVar8->logCbData).player = this;
        (pDVar8->logCbData).chipDevID = sVar11;
        p_Var1 = ((pDVar8->base).defInf.devDef)->SetLogCB;
        if (p_Var1 != (DEVFUNC_SETLOGCB)0x0) {
          (*p_Var1)((pDVar8->base).defInf.dataPtr,SndEmuLogCB,&pDVar8->logCbData);
        }
        SetupLinkedDevices(&pDVar8->base,(SETUPLINKDEV_CB)0x0,(void *)0x0);
        if (sVar7 != 0xffffffffffffffff) {
          p_Var2 = ((pDVar8->base).defInf.devDef)->SetOptionBits;
          if (p_Var2 != (DEVFUNC_OPTMASK)0x0) {
            (*p_Var2)((pDVar8->base).defInf.dataPtr,pUVar10[4]);
          }
          this->_optDevMap[pDVar8->optID] = sVar11;
        }
        do {
          if (sVar7 == 0xffffffffffffffff) {
            UVar4 = '\0';
          }
          else {
            UVar4 = *(UINT8 *)((long)pUVar10 + 9);
            p_Var2 = ((pDVar8->base).defInf.devDef)->SetMuteMask;
            if (p_Var2 != (DEVFUNC_OPTMASK)0x0) {
              (*p_Var2)((pDVar8->base).defInf.dataPtr,pUVar10[6]);
            }
          }
          CAA = &(pDVar8->base).resmpl;
          Resmpl_SetVals(CAA,UVar4,0x100,(this->super_PlayerBase)._outSmplRate);
          puVar9 = (this->_devPanning).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          bVar5 = puVar9[sVar11];
          if ((bVar5 & 2) != 0) {
            (pDVar8->base).resmpl.volumeL = 0;
            bVar5 = puVar9[sVar11];
          }
          if ((bVar5 & 1) != 0) {
            (pDVar8->base).resmpl.volumeR = 0;
          }
          Resmpl_DevConnect(CAA,(DEV_INFO *)pDVar8);
          Resmpl_Init(CAA);
          pDVar8 = (pointer)(pDVar8->base).linkDev;
        } while (pDVar8 != (pointer)0x0);
      }
      else {
        (pDVar8->base).defInf.dataPtr = (DEV_DATA *)0x0;
        (pDVar8->base).defInf.devDef = (DEV_DEF *)0x0;
      }
      sVar11 = sVar11 + 1;
      puVar9 = (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (sVar11 < (ulong)((long)(this->_devTypes).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar9));
  }
  this->_playState = this->_playState | 1;
  (*(this->super_PlayerBase)._vptr_PlayerBase[0x21])(this);
  p_Var3 = (this->super_PlayerBase)._eventCbFunc;
  if (p_Var3 != (PLAYER_EVENT_CB)0x0) {
    (*p_Var3)(&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x01',(void *)0x0);
  }
  return '\0';
}

Assistant:

UINT8 DROPlayer::Start(void)
{
	size_t curDev;
	UINT8 retVal;
	
	for (curDev = 0; curDev < 3; curDev ++)
		_optDevMap[curDev] = (size_t)-1;
	
	_devices.clear();
	_devices.resize(_devTypes.size());
	for (curDev = 0; curDev < _devTypes.size(); curDev ++)
	{
		DRO_CHIPDEV* cDev = &_devices[curDev];
		PLR_DEV_OPTS* devOpts;
		DEV_GEN_CFG* devCfg = &_devCfgs[curDev];
		VGM_BASEDEV* clDev;
		
		cDev->base.defInf.dataPtr = NULL;
		cDev->base.linkDev = NULL;
		cDev->optID = DeviceID2OptionID((UINT32)curDev);
		
		devOpts = (cDev->optID != (size_t)-1) ? &_devOpts[cDev->optID] : NULL;
		devCfg->emuCore = (devOpts != NULL) ? devOpts->emuCore[0] : 0x00;
		devCfg->srMode = (devOpts != NULL) ? devOpts->srMode : DEVRI_SRMODE_NATIVE;
		if (devOpts != NULL && devOpts->smplRate)
			devCfg->smplRate = devOpts->smplRate;
		else
			devCfg->smplRate = _outSmplRate;
		
		retVal = SndEmu_Start(_devTypes[curDev], devCfg, &cDev->base.defInf);
		if (retVal)
		{
			cDev->base.defInf.dataPtr = NULL;
			cDev->base.defInf.devDef = NULL;
			continue;
		}
		SndEmu_GetDeviceFunc(cDev->base.defInf.devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&cDev->write);
		
		cDev->logCbData.player = this;
		cDev->logCbData.chipDevID = curDev;
		if (cDev->base.defInf.devDef->SetLogCB != NULL)
			cDev->base.defInf.devDef->SetLogCB(cDev->base.defInf.dataPtr, DROPlayer::SndEmuLogCB, &cDev->logCbData);
		SetupLinkedDevices(&cDev->base, NULL, NULL);
		
		if (devOpts != NULL)
		{
			if (cDev->base.defInf.devDef->SetOptionBits != NULL)
				cDev->base.defInf.devDef->SetOptionBits(cDev->base.defInf.dataPtr, devOpts->coreOpts);
			
			_optDevMap[cDev->optID] = curDev;
		}
		
		for (clDev = &cDev->base; clDev != NULL; clDev = clDev->linkDev)
		{
			UINT8 resmplMode = (devOpts != NULL) ? devOpts->resmplMode : RSMODE_LINEAR;
			
			if (devOpts != NULL && clDev->defInf.devDef->SetMuteMask != NULL)
				clDev->defInf.devDef->SetMuteMask(clDev->defInf.dataPtr, devOpts->muteOpts.chnMute[0]);
			
			Resmpl_SetVals(&clDev->resmpl, resmplMode, 0x100, _outSmplRate);
			// do DualOPL2 hard panning by muting either the left or right speaker
			if (_devPanning[curDev] & 0x02)
				clDev->resmpl.volumeL = 0x00;
			if (_devPanning[curDev] & 0x01)
				clDev->resmpl.volumeR = 0x00;
			Resmpl_DevConnect(&clDev->resmpl, &clDev->defInf);
			Resmpl_Init(&clDev->resmpl);
		}
	}
	
	_playState |= PLAYSTATE_PLAY;
	Reset();
	if (_eventCbFunc != NULL)
		_eventCbFunc(this, _eventCbParam, PLREVT_START, NULL);
	
	return 0x00;
}